

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O3

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,LengthWithCavity *lengthWithCavity)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_58;
  function<BSDFData::LengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>)> local_38;
  
  FileParse::operator>>(node,&lengthWithCavity->value);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"cavity","");
  FileParse::loadAttribute<XMLNodeAdapter,_int,_0>(node,&local_58,&lengthWithCavity->cavity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"unit","");
  local_38.super__Function_base._M_functor._8_8_ = 0;
  local_38.super__Function_base._M_functor._M_unused._M_object = LengthUnitFromString;
  local_38._M_invoker =
       std::
       _Function_handler<BSDFData::LengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::LengthUnit_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
       ::_M_invoke;
  local_38.super__Function_base._M_manager =
       std::
       _Function_handler<BSDFData::LengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::LengthUnit_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
       ::_M_manager;
  FileParse::loadAttribute<XMLNodeAdapter,_BSDFData::LengthUnit,_0>
            (node,&local_58,&lengthWithCavity->unit,&local_38);
  if (local_38.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.super__Function_base._M_manager)
              ((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return node;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node,
                                   BSDFData::LengthWithCavity & lengthWithCavity)
    {
        using FileParse::operator>>;   // operators for basic C++ types are in the FileParse
                                       // namespace

        node >> lengthWithCavity.value;
        FileParse::loadAttribute(node, "cavity", lengthWithCavity.cavity);
        FileParse::loadAttribute<NodeAdapter, BSDFData::LengthUnit>(
          node, "unit", lengthWithCavity.unit, LengthUnitFromString);

        return node;
    }